

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_compute_ttf_font_glyph_metrics
               (rf_ttf_font_info *font_info,int *codepoints,rf_int codepoints_count,
               rf_glyph_info *dst,rf_int dst_count)

{
  anon_struct_160_20_e7d3dea2_for_internal_stb_font_info *info;
  float fVar1;
  float unicode_codepoint;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  float *pfVar8;
  stbtt_fontinfo *stbtt_ctx;
  long lVar9;
  long in_FS_OFFSET;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int end_y;
  int end_x;
  int begin_y;
  int begin_x;
  int local_48;
  int local_44;
  float local_40;
  float local_3c;
  int *local_38;
  
  if ((((font_info != (rf_ttf_font_info *)0x0) && (codepoints_count <= dst_count)) &&
      (dst != (rf_glyph_info *)0x0)) && (font_info->valid != false)) {
    *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
    font_info->largest_glyph_size = 0;
    if (0 < codepoints_count) {
      info = &font_info->internal_stb_font_info;
      pfVar8 = &(dst->field_0).rec.width;
      lVar9 = 0;
      local_38 = codepoints;
      do {
        unicode_codepoint = (float)local_38[lVar9];
        pfVar8[2] = unicode_codepoint;
        local_3c = 0.0;
        local_40 = 0.0;
        local_44 = 0;
        local_48 = 0;
        fVar1 = font_info->scale_factor;
        iVar6 = stbtt_FindGlyphIndex((stbtt_fontinfo *)info,(int)unicode_codepoint);
        stbtt_GetGlyphBitmapBoxSubpixel
                  ((stbtt_fontinfo *)info,iVar6,fVar1,fVar1,in_XMM2_Da,in_XMM3_Da,(int *)&local_3c,
                   (int *)&local_40,&local_44,&local_48);
        *pfVar8 = (float)(local_44 - (int)local_3c);
        pfVar8[1] = (float)(local_48 - (int)local_40);
        pfVar8[3] = local_3c;
        pfVar8[4] = local_40;
        fVar1 = font_info->scale_factor;
        pfVar8[4] = (float)((int)((float)font_info->ascent * fVar1) + (int)local_40);
        iVar6 = stbtt_FindGlyphIndex((stbtt_fontinfo *)info,(int)pfVar8[2]);
        puVar3 = (font_info->internal_stb_font_info).data;
        uVar7 = (uint)(ushort)(*(ushort *)
                                (puVar3 + (long)(font_info->internal_stb_font_info).hhea + 0x22) <<
                               8 | *(ushort *)
                                    (puVar3 + (long)(font_info->internal_stb_font_info).hhea + 0x22)
                                   >> 8);
        if (iVar6 < (int)uVar7) {
          iVar2 = (font_info->internal_stb_font_info).hmtx;
          lVar4 = (long)(iVar6 << 2) + (long)iVar2;
          lVar5 = (long)(iVar6 << 2) + (long)iVar2 + 1;
        }
        else {
          iVar6 = (font_info->internal_stb_font_info).hmtx;
          lVar4 = (ulong)uVar7 * 4 + (long)iVar6 + -4;
          lVar5 = (ulong)uVar7 * 4 + (long)iVar6 + -3;
        }
        pfVar8[5] = (float)(int)(fVar1 * (float)(int)CONCAT11(puVar3[lVar4],puVar3[lVar5]));
        if (font_info->largest_glyph_size < (int)(*pfVar8 * pfVar8[1])) {
          font_info->largest_glyph_size = (int)(*pfVar8 * pfVar8[1]);
        }
        lVar9 = lVar9 + 1;
        pfVar8 = pfVar8 + 8;
      } while (codepoints_count != lVar9);
    }
  }
  return;
}

Assistant:

RF_API void rf_compute_ttf_font_glyph_metrics(rf_ttf_font_info* font_info, const int* codepoints, rf_int codepoints_count, rf_glyph_info* dst, rf_int dst_count)
{
    if (font_info && font_info->valid)
    {
        if (dst && dst_count >= codepoints_count)
        {
            // The stbtt functions called here should not require any allocations
            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

            font_info->largest_glyph_size = 0;

            float required_area = 0;

            // NOTE: Using simple packaging, one char after another
            for (rf_int i = 0; i < codepoints_count; i++)
            {
                stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                dst[i].codepoint = codepoints[i];

                int begin_x = 0;
                int begin_y = 0;
                int end_x   = 0;
                int end_y   = 0;
                stbtt_GetCodepointBitmapBox(stbtt_ctx, dst[i].codepoint, font_info->scale_factor, font_info->scale_factor, &begin_x, &begin_y, &end_x, &end_y);

                dst[i].width  = end_x - begin_x;
                dst[i].height = end_y - begin_y;
                dst[i].offset_x = begin_x;
                dst[i].offset_y = begin_y;
                dst[i].offset_y += (int) ((float)font_info->ascent * font_info->scale_factor);

                stbtt_GetCodepointHMetrics(stbtt_ctx, dst[i].codepoint, &dst[i].advance_x, NULL);
                dst[i].advance_x *= font_info->scale_factor;

                const int char_size = dst[i].width * dst[i].height;
                if (char_size > font_info->largest_glyph_size) font_info->largest_glyph_size = char_size;
            }
        }
    }
}